

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo5.cpp
# Opt level: O2

int64_t primecount::pi_lmo5(int64_t x,bool is_print)

{
  uint64_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 res [16];
  byte bVar5;
  int *piVar6;
  uchar *puVar7;
  uint *puVar8;
  int *piVar9;
  bool bVar10;
  int iVar11;
  uint64_t c;
  int64_t iVar12;
  uint64_t uVar13;
  long *plVar14;
  long lVar15;
  uint64_t uVar16;
  long lVar17;
  ulong uVar18;
  uint64_t uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  uint64_t low;
  ulong uVar24;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  ulong uVar25;
  uint64_t uVar26;
  long lVar27;
  uint64_t i;
  ulong uVar28;
  uint64_t uVar29;
  uint64_t uVar30;
  ulong uVar31;
  uint64_t uVar32;
  uint64_t high;
  undefined1 in_R9B;
  uint64_t uVar33;
  int64_t m;
  double dVar34;
  double dVar35;
  string_view_t str;
  string_view_t str_00;
  string_view_t str_01;
  string_view_t str_02;
  string_view_t str_03;
  string_view_t str_04;
  string_view_t str_05;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  long local_208;
  type primes;
  Vector<long,_std::allocator<long>_> local_158;
  Sieve sieve;
  double local_b0;
  Vector<int,_std::allocator<int>_> pi;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  char *extraout_RDX;
  
  if (x < 2) {
    iVar12 = 0;
  }
  else {
    x_00._8_8_ = in_stack_fffffffffffffdf0;
    x_00._0_8_ = in_stack_fffffffffffffde8;
    dVar34 = get_alpha_lmo((primecount *)x,(maxint_t)x_00);
    dVar35 = cbrt((double)x);
    uVar28 = (ulong)dVar35;
    uVar22 = (long)uVar28 >> 0x3f & uVar28;
    for (; (uVar18 = uVar22, 0 < (long)uVar28 &&
           (uVar18 = uVar28,
           uVar28 * uVar28 - (ulong)x / uVar28 != 0 &&
           (long)((ulong)x / uVar28) <= (long)(uVar28 * uVar28))); uVar28 = uVar28 - 1) {
    }
    lVar23 = uVar18 - 1;
    do {
      lVar15 = lVar23 + 2;
      lVar23 = lVar23 + 1;
    } while (lVar15 * lVar15 - x / lVar15 == 0 || lVar15 * lVar15 < x / lVar15);
    uVar22 = (ulong)(dVar34 * (double)lVar23);
    if (uVar22 < 0x14) {
      c = (uint64_t)(byte)PhiTiny::pi[uVar22];
    }
    else {
      c = 8;
    }
    if (is_print) {
      str._M_str = (char *)(x % (long)uVar22);
      str._M_len = (size_t)"";
      print((primecount *)0x0,str);
      str_00._M_str = extraout_RDX;
      str_00._M_len = (size_t)"=== pi_lmo5(x) ===";
      print((primecount *)0x12,str_00);
      str_01._M_str = extraout_RDX_00;
      str_01._M_len = (size_t)"pi(x) = S1 + S2 + pi(y) - 1 - P2";
      print((primecount *)0x20,str_01);
      in_R9B = 1;
      x_01._8_8_ = in_stack_fffffffffffffdf0;
      x_01._0_8_ = in_stack_fffffffffffffde8;
      print((primecount *)x,(maxint_t)x_01,0,uVar22,x / (long)uVar22,(int)c);
    }
    generate_primes_i32(&primes,uVar22);
    generate_lpf(&lpf,uVar22);
    generate_moebius(&mu,uVar22);
    lVar23 = (long)primes.end_ - (long)primes.array_;
    bVar10 = primecount::is_print();
    lVar23 = (lVar23 >> 2) + -1;
    uVar28 = P2((primecount *)x,uVar22,lVar23,1,(uint)bVar10,(bool)in_R9B);
    iVar12 = S1(x,uVar22,c,1,is_print);
    if (is_print) {
      str_02._M_str = extraout_RDX_01;
      str_02._M_len = (size_t)"";
      print((primecount *)0x0,str_02);
      str_03._M_str = extraout_RDX_02;
      str_03._M_len = (size_t)"=== S2(x, y) ===";
      print((primecount *)0x10,str_03);
      str_04._M_str = extraout_RDX_03;
      str_04._M_len = (size_t)"Algorithm: POPCNT64 bit counting";
      print((primecount *)0x20,str_04);
      local_b0 = get_time();
    }
    uVar13 = x / (long)uVar22;
    dVar34 = (double)(long)uVar13;
    if (dVar34 < 0.0) {
      dVar34 = sqrt(dVar34);
    }
    else {
      dVar34 = SQRT(dVar34);
    }
    uVar30 = 0xb504f333;
    if ((long)dVar34 < 0xb504f333) {
      uVar30 = (long)dVar34;
    }
    if ((long)uVar13 < (long)(uVar30 * uVar30)) {
      do {
        uVar30 = uVar30 - 1;
      } while (uVar30 * uVar30 - uVar13 != 0 && (long)uVar13 <= (long)(uVar30 * uVar30));
    }
    else {
      lVar15 = uVar30 * 2;
      if (lVar15 < (long)(uVar13 - uVar30 * uVar30)) {
        do {
          uVar30 = uVar30 + 1;
          lVar15 = lVar15 + 2;
        } while (lVar15 < (long)(uVar13 - uVar30 * uVar30));
      }
    }
    uVar30 = Sieve::align_segment_size(uVar30);
    Sieve::Sieve(&sieve,0,uVar30,(long)primes.end_ - (long)primes.array_ >> 2);
    generate_pi(&pi,uVar22);
    Vector<long,_std::allocator<long>_>::Vector
              (&local_158,(long)primes.end_ - (long)primes.array_ >> 2);
    for (plVar14 = local_158.array_; plVar14 != local_158.end_; plVar14 = plVar14 + 1) {
      *plVar14 = 0;
    }
    dVar34 = (double)(long)uVar22;
    if (dVar34 < 0.0) {
      dVar34 = sqrt(dVar34);
    }
    else {
      dVar34 = SQRT(dVar34);
    }
    lVar15 = 0xb504f333;
    if ((long)dVar34 < 0xb504f333) {
      lVar15 = (long)dVar34;
    }
    if ((long)uVar22 < lVar15 * lVar15) {
      do {
        lVar15 = lVar15 + -1;
      } while (lVar15 * lVar15 - uVar22 != 0 && (long)uVar22 <= lVar15 * lVar15);
    }
    else {
      lVar27 = lVar15 * 2;
      if (lVar27 < (long)(uVar22 - lVar15 * lVar15)) {
        do {
          lVar15 = lVar15 + 1;
          lVar27 = lVar27 + 2;
        } while (lVar27 < (long)(uVar22 - lVar15 * lVar15));
      }
    }
    iVar2 = pi.array_[lVar15];
    iVar3 = pi.array_[uVar22];
    lVar15 = 0;
    uVar1 = 0;
LAB_0011681f:
    low = uVar1;
    if ((long)low < (long)uVar13) {
      uVar1 = low + uVar30;
      high = uVar1;
      if ((long)uVar13 < (long)uVar1) {
        high = uVar13;
      }
      uVar16 = 1;
      if (1 < (long)low) {
        uVar16 = low;
      }
      Sieve::pre_sieve<int>(&sieve,&primes,c,low,high);
      uVar29 = c;
      while (piVar9 = lpf.array_, piVar6 = mu.array_, puVar8 = sieve.counter_.counter.array_,
            uVar32 = sieve.counter_.dist, puVar7 = sieve.sieve_.array_, plVar14 = local_158.array_,
            bVar5 = (anonymous_namespace)::cpu_supports_popcnt, i = uVar29 + 1,
            (long)uVar29 < (long)iVar2) {
        iVar11 = primes.array_[i];
        uVar29 = (uint64_t)iVar11;
        lVar17 = x / (long)(high * uVar29);
        lVar27 = (long)uVar22 / (long)uVar29;
        if ((long)uVar22 / (long)uVar29 < lVar17) {
          lVar27 = lVar17;
        }
        uVar18 = x / (long)(uVar16 * uVar29);
        if ((long)uVar22 <= (long)uVar18) {
          uVar18 = uVar22;
        }
        if ((long)uVar18 <= (long)uVar29) goto LAB_0011681f;
        for (; lVar27 < (long)uVar18; uVar18 = uVar18 - 1) {
          iVar4 = piVar6[uVar18];
          if (((long)iVar4 != 0) && (iVar11 < piVar9[uVar18])) {
            uVar24 = x / (long)(uVar18 * uVar29) - low;
            uVar19 = sieve.prev_stop_ + 1;
            sieve.prev_stop_ = uVar24;
            if (uVar19 <= uVar24) {
              for (; sieve.counter_.stop <= uVar24;
                  sieve.counter_.stop = sieve.counter_.stop + uVar32) {
                sieve.count_ = sieve.counter_.sum + puVar8[sieve.counter_.i];
                uVar19 = sieve.counter_.stop;
                sieve.counter_.sum = sieve.count_;
                sieve.counter_.i = sieve.counter_.i + 1;
              }
              uVar20 = uVar19 / 0xf0;
              uVar21 = uVar24 / 0xf0;
              uVar25 = *(ulong *)(Sieve::unset_larger + (uVar24 % 0xf0) * 8);
              uVar31 = 0xffffffffffffffff;
              if (uVar20 == uVar21) {
                uVar25 = 0;
                uVar31 = *(ulong *)(Sieve::unset_larger + (uVar24 % 0xf0) * 8);
              }
              uVar31 = uVar31 & *(ulong *)(Sieve::unset_smaller + (uVar19 % 0xf0) * 8) &
                       *(ulong *)(puVar7 + uVar20 * 8);
              uVar24 = *(ulong *)(puVar7 + uVar21 * 8);
              if ((bVar5 & 1) == 0) {
                uVar33 = anon_unknown.dwarf_82f45::popcnt64_bitwise_noinline(uVar31);
                uVar19 = anon_unknown.dwarf_82f45::popcnt64_bitwise_noinline(uVar25 & uVar24);
              }
              else {
                uVar33 = POPCOUNT(uVar31);
                uVar19 = POPCOUNT(uVar25 & uVar24);
              }
              lVar17 = uVar33 + uVar19;
              while (uVar20 = uVar20 + 1, uVar20 < uVar21) {
                if ((bVar5 & 1) == 0) {
                  uVar19 = anon_unknown.dwarf_82f45::popcnt64_bitwise_noinline
                                     (*(uint64_t *)(puVar7 + uVar20 * 8));
                }
                else {
                  uVar19 = POPCOUNT(*(uint64_t *)(puVar7 + uVar20 * 8));
                }
                lVar17 = lVar17 + uVar19;
              }
              sieve.count_ = lVar17 + sieve.count_;
            }
            lVar15 = lVar15 - (sieve.count_ + plVar14[i]) * (long)iVar4;
          }
        }
        plVar14 = plVar14 + i;
        *plVar14 = *plVar14 + sieve.total_count_;
        Sieve::cross_off_count(&sieve,uVar29,i);
        uVar29 = i;
      }
      for (; puVar8 = sieve.counter_.counter.array_, uVar29 = sieve.counter_.dist,
          puVar7 = sieve.sieve_.array_, plVar14 = local_158.array_, piVar6 = primes.array_,
          bVar5 = (anonymous_namespace)::cpu_supports_popcnt, (long)i < (long)iVar3; i = i + 1) {
        uVar32 = (uint64_t)primes.array_[i];
        uVar18 = x / (long)(uVar16 * uVar32);
        if ((long)uVar22 <= (long)uVar18) {
          uVar18 = uVar22;
        }
        local_208 = (long)pi.array_[uVar18];
        uVar19 = x / (long)(high * uVar32);
        if ((long)uVar19 <= (long)uVar32) {
          uVar19 = uVar32;
        }
        iVar11 = primes.array_[local_208];
        if (iVar11 <= primes.array_[i]) break;
        while( true ) {
          if ((long)iVar11 <= (long)uVar19) break;
          uVar18 = x / (long)((long)iVar11 * uVar32) - low;
          uVar33 = sieve.prev_stop_ + 1;
          sieve.prev_stop_ = uVar18;
          if (uVar33 <= uVar18) {
            for (; sieve.counter_.stop <= uVar18; sieve.counter_.stop = sieve.counter_.stop + uVar29
                ) {
              sieve.count_ = sieve.counter_.sum + puVar8[sieve.counter_.i];
              uVar33 = sieve.counter_.stop;
              sieve.counter_.sum = sieve.count_;
              sieve.counter_.i = sieve.counter_.i + 1;
            }
            uVar24 = uVar33 / 0xf0;
            uVar25 = uVar18 / 0xf0;
            uVar31 = *(ulong *)(Sieve::unset_larger + (uVar18 % 0xf0) * 8);
            uVar20 = 0xffffffffffffffff;
            if (uVar24 == uVar25) {
              uVar31 = 0;
              uVar20 = *(ulong *)(Sieve::unset_larger + (uVar18 % 0xf0) * 8);
            }
            uVar20 = uVar20 & *(ulong *)(Sieve::unset_smaller + (uVar33 % 0xf0) * 8) &
                     *(ulong *)(puVar7 + uVar24 * 8);
            uVar18 = *(ulong *)(puVar7 + uVar25 * 8);
            if ((bVar5 & 1) == 0) {
              uVar26 = anon_unknown.dwarf_82f45::popcnt64_bitwise_noinline(uVar20);
              uVar33 = anon_unknown.dwarf_82f45::popcnt64_bitwise_noinline(uVar31 & uVar18);
            }
            else {
              uVar26 = POPCOUNT(uVar20);
              uVar33 = POPCOUNT(uVar31 & uVar18);
            }
            lVar27 = uVar26 + uVar33;
            while (uVar24 = uVar24 + 1, uVar24 < uVar25) {
              if ((bVar5 & 1) == 0) {
                uVar33 = anon_unknown.dwarf_82f45::popcnt64_bitwise_noinline
                                   (*(uint64_t *)(puVar7 + uVar24 * 8));
              }
              else {
                uVar33 = POPCOUNT(*(uint64_t *)(puVar7 + uVar24 * 8));
              }
              lVar27 = lVar27 + uVar33;
            }
            sieve.count_ = lVar27 + sieve.count_;
          }
          lVar15 = sieve.count_ + lVar15 + plVar14[i];
          iVar11 = piVar6[local_208 + -1];
          local_208 = local_208 + -1;
        }
        plVar14 = plVar14 + i;
        *plVar14 = *plVar14 + sieve.total_count_;
        Sieve::cross_off_count(&sieve,uVar32,i);
      }
      goto LAB_0011681f;
    }
    if (is_print) {
      res._8_8_ = uVar13;
      res._0_8_ = in_stack_fffffffffffffde8;
      str_05._M_str = "S2";
      str_05._M_len = 2;
      print(str_05,(maxint_t)res,local_b0);
    }
    Vector<long,_std::allocator<long>_>::~Vector(&local_158);
    Vector<int,_std::allocator<int>_>::~Vector(&pi);
    Sieve::~Sieve(&sieve);
    iVar12 = iVar12 + lVar15 + lVar23 + ~uVar28;
    Vector<int,_std::allocator<int>_>::~Vector(&mu);
    Vector<int,_std::allocator<int>_>::~Vector(&lpf);
    Vector<int,_std::allocator<int>_>::~Vector(&primes);
  }
  return iVar12;
}

Assistant:

int64_t pi_lmo5(int64_t x, bool is_print)
{
  if (x < 2)
    return 0;

  int threads = 1;
  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  if (is_print)
  {
    print("");
    print("=== pi_lmo5(x) ===");
    print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
    print(x, y, z, c, threads);
  }

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);
  int64_t s1 = S1(x, y, c, threads, is_print);
  int64_t s2 = S2(x, y, c, primes, lpf, mu, is_print);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}